

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void __thiscall efsw::String::String(String *this,StringBaseType utf32Char)

{
  StringBaseType utf32Char_local;
  String *this_local;
  
  std::__cxx11::u32string::u32string((u32string *)this);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  operator+=(&this->mString,utf32Char);
  return;
}

Assistant:

String::String( StringBaseType utf32Char ) {
	mString += utf32Char;
}